

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

bool __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::PopLM(Geobucket<2UL> *this,MM<6UL> *lm)

{
  size_t *psVar1;
  pointer pMVar2;
  pointer pMVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  pMVar2 = (this->_buckets).
           super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->_buckets).
                super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 5;
  lVar7 = -1;
  do {
    lVar6 = lVar6 + -1;
    pMVar3 = (this->_buckets).
             super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(size_t *)
         ((long)&pMVar3[lVar6].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                 super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + 0x10) != 0) {
      if (lVar7 != -1) {
        iVar5 = MOGrevlex<6UL>::Compare
                          ((MOGrevlex<6UL> *)&pMVar2->field_0x18,
                           (MM<6UL> *)
                           (*(long *)&pMVar3[lVar6].
                                      super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                                      super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>
                           + 0x10),lm);
        if (iVar5 < 1) {
          if (iVar5 == 0) {
            pMVar3 = (this->_buckets).
                     super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar4 = *(void **)&pMVar3[lVar7].
                                super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                                super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>;
            psVar1 = (size_t *)
                     ((long)&pMVar3[lVar7].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                             super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + 0x10);
            *psVar1 = *psVar1 - 1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(pvVar4,0x18);
            pMVar3 = (this->_buckets).
                     super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar4 = *(void **)&pMVar3[lVar6].
                                super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                                super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>;
            psVar1 = (size_t *)
                     ((long)&pMVar3[lVar6].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                             super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + 0x10);
            *psVar1 = *psVar1 - 1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(pvVar4,0x18);
            lVar6 = (long)(this->_buckets).
                          super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_buckets).
                          super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5;
            lVar7 = -1;
          }
          goto LAB_00136edb;
        }
      }
      (lm->super_WW<6UL>)._words[0] =
           *(word *)(*(long *)&(this->_buckets).
                               super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar6].
                               super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                               super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + 0x10
                    );
      lVar7 = lVar6;
    }
LAB_00136edb:
    if (lVar6 == 0) {
      if (lVar7 != -1) {
        pMVar2 = (this->_buckets).
                 super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = *(void **)&pMVar2[lVar7].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                            super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>;
        psVar1 = (size_t *)
                 ((long)&pMVar2[lVar7].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                         super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + 0x10);
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pvVar4,0x18);
      }
      return lVar7 != -1;
    }
  } while( true );
}

Assistant:

bool PopLM(MM<_n>& lm)
		{
			int cmp;
			size_t i = SIZE_MAX, j = (size_t)_buckets.size();
			const _O& o = _buckets[0].GetOrder();
			do
			{
				// пропускаем пустые корзины
				if (_buckets[--j].IsEmpty())
					continue;
				// новый старший моном?
				if (i == SIZE_MAX || (cmp = o.Compare(_buckets[j].LM(), lm)) > 0)
					lm = _buckets[i = j].LM();
				// одинаковые мономы?
				else if (cmp == 0) 
				{
					// удаляем мономы из корзин и начинаем все сначала
					_buckets[i].PopLM(), _buckets[j].PopLM();
					i = SIZE_MAX, j = (size_t)_buckets.size();
				}
			}
			while (j != 0);
			// моногочлен ненулевой?
			if (i != SIZE_MAX) _buckets[i].PopLM();
			// признак успеха
			return i != SIZE_MAX;
		}